

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::mouseDoubleClickEvent(QGraphicsView *this,QMouseEvent *event)

{
  QGraphicsViewPrivate *this_00;
  Data *pDVar1;
  qreal qVar2;
  undefined1 uVar3;
  bool bVar4;
  MouseEventSource source;
  MouseEventFlags flags;
  QPoint QVar5;
  QWidget *widget;
  QObject *pQVar6;
  long in_FS_OFFSET;
  QPointF QVar7;
  QPointF local_68;
  undefined1 local_58 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this_00->scene);
  if ((bVar4) && ((this_00->field_0x300 & 1) != 0)) {
    QGraphicsViewPrivate::storeMouseEvent(this_00,event);
    QVar7 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_58._8_8_ = QVar7.yp;
    local_58._0_8_ = QVar7.xp;
    QVar5 = QPointF::toPoint((QPointF *)local_58);
    this_00->mousePressViewPoint = QVar5;
    QVar7 = mapToScene(this,&this_00->mousePressViewPoint);
    (this_00->mousePressScenePoint).xp = QVar7.xp;
    (this_00->mousePressScenePoint).yp = QVar7.yp;
    QVar7 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    local_58._8_8_ = QVar7.yp;
    local_58._0_8_ = QVar7.xp;
    QVar5 = QPointF::toPoint((QPointF *)local_58);
    this_00->mousePressScreenPoint = QVar5;
    qVar2 = (this_00->mousePressScenePoint).yp;
    (this_00->lastMouseMoveScenePoint).xp = (this_00->mousePressScenePoint).xp;
    (this_00->lastMouseMoveScenePoint).yp = qVar2;
    this_00->lastMouseMoveScreenPoint = QVar5;
    this_00->mousePressButton = *(MouseButton *)(event + 0x40);
    local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
              ((QGraphicsSceneMouseEvent *)local_58,GraphicsSceneMouseDoubleClick);
    widget = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,widget);
    QGraphicsSceneMouseEvent::setButtonDownScenePos
              ((QGraphicsSceneMouseEvent *)local_58,this_00->mousePressButton,
               &this_00->mousePressScenePoint);
    QGraphicsSceneMouseEvent::setButtonDownScreenPos
              ((QGraphicsSceneMouseEvent *)local_58,this_00->mousePressButton,
               &this_00->mousePressScreenPoint);
    QVar7 = mapToScene(this,&this_00->mousePressViewPoint);
    local_68.yp = QVar7.yp;
    local_68.xp = QVar7.xp;
    QGraphicsSceneMouseEvent::setScenePos((QGraphicsSceneMouseEvent *)local_58,&local_68);
    QGraphicsSceneMouseEvent::setScreenPos
              ((QGraphicsSceneMouseEvent *)local_58,&this_00->mousePressScreenPoint);
    QGraphicsSceneMouseEvent::setLastScenePos
              ((QGraphicsSceneMouseEvent *)local_58,&this_00->lastMouseMoveScenePoint);
    QGraphicsSceneMouseEvent::setLastScreenPos
              ((QGraphicsSceneMouseEvent *)local_58,&this_00->lastMouseMoveScreenPoint);
    QGraphicsSceneMouseEvent::setButtons
              ((QGraphicsSceneMouseEvent *)local_58,
               (QFlagsStorageHelper<Qt::MouseButton,_4>)
               *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
    local_58[0xc] = 0;
    QGraphicsSceneMouseEvent::setButton
              ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(event + 0x40));
    QGraphicsSceneMouseEvent::setModifiers
              ((QGraphicsSceneMouseEvent *)local_58,
               (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
               *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
    source = QMouseEvent::source();
    QGraphicsSceneMouseEvent::setSource((QGraphicsSceneMouseEvent *)local_58,source);
    flags.super_QFlagsStorageHelper<Qt::MouseEventFlag,_4>.super_QFlagsStorage<Qt::MouseEventFlag>.i
         = (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)QMouseEvent::flags();
    QGraphicsSceneMouseEvent::setFlags((QGraphicsSceneMouseEvent *)local_58,flags);
    QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
    pDVar1 = (this_00->scene).wp.d;
    if (event[0xb] == (QMouseEvent)0x1) {
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = (this_00->scene).wp.value;
      }
      qt_sendSpontaneousEvent(pQVar6,(QEvent *)local_58);
    }
    else {
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = (this_00->scene).wp.value;
      }
      QCoreApplication::sendEvent(pQVar6,(QEvent *)local_58);
    }
    uVar3 = local_58[0xc];
    (**(code **)(*(long *)event + 0x10))(event,local_58[0xc]);
    (**(code **)(*(long *)&(this_00->lastMouseEvent).field_0 + 0x10))
              (&this_00->lastMouseEvent,uVar3);
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;

    d->storeMouseEvent(event);
    d->mousePressViewPoint = event->position().toPoint();
    d->mousePressScenePoint = mapToScene(d->mousePressViewPoint);
    d->mousePressScreenPoint = event->globalPosition().toPoint();
    d->lastMouseMoveScenePoint = d->mousePressScenePoint;
    d->lastMouseMoveScreenPoint = d->mousePressScreenPoint;
    d->mousePressButton = event->button();

    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseDoubleClick);
    mouseEvent.setWidget(viewport());
    mouseEvent.setButtonDownScenePos(d->mousePressButton, d->mousePressScenePoint);
    mouseEvent.setButtonDownScreenPos(d->mousePressButton, d->mousePressScreenPoint);
    mouseEvent.setScenePos(mapToScene(d->mousePressViewPoint));
    mouseEvent.setScreenPos(d->mousePressScreenPoint);
    mouseEvent.setLastScenePos(d->lastMouseMoveScenePoint);
    mouseEvent.setLastScreenPos(d->lastMouseMoveScreenPoint);
    mouseEvent.setButtons(event->buttons());
    mouseEvent.setAccepted(false);
    mouseEvent.setButton(event->button());
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setSource(event->source());
    mouseEvent.setFlags(event->flags());
    mouseEvent.setTimestamp(event->timestamp());
    if (event->spontaneous())
        qt_sendSpontaneousEvent(d->scene, &mouseEvent);
    else
        QCoreApplication::sendEvent(d->scene, &mouseEvent);

    // Update the original mouse event accepted state.
    const bool isAccepted = mouseEvent.isAccepted();
    event->setAccepted(isAccepted);

    // Update the last mouse event accepted state.
    d->lastMouseEvent->setAccepted(isAccepted);
}